

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O3

void duckdb::AggregateExecutor::
     UnaryScatter<duckdb::SumState<long>,long,duckdb::IntegerSumOperation>
               (Vector *input,Vector *states,AggregateInputData *aggr_input_data,idx_t count)

{
  long *plVar1;
  unsigned_long *puVar2;
  long *plVar3;
  undefined1 *puVar4;
  sel_t *psVar5;
  sel_t *psVar6;
  data_ptr_t pdVar7;
  data_ptr_t pdVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  idx_t iVar14;
  idx_t iVar15;
  idx_t iVar16;
  ulong uVar17;
  UnifiedVectorFormat idata;
  UnifiedVectorFormat sdata;
  UnifiedVectorFormat local_b8;
  UnifiedVectorFormat local_70;
  
  if (input->vector_type == FLAT_VECTOR) {
    if (states->vector_type == FLAT_VECTOR) {
      pdVar7 = input->data;
      pdVar8 = states->data;
      FlatVector::VerifyFlatVector(input);
      puVar2 = (input->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if (puVar2 == (unsigned_long *)0x0) {
        if (count == 0) {
          return;
        }
        iVar14 = 0;
        do {
          puVar4 = *(undefined1 **)(pdVar8 + iVar14 * 8);
          *puVar4 = 1;
          plVar1 = (long *)(puVar4 + 8);
          *plVar1 = *plVar1 + *(long *)(pdVar7 + iVar14 * 8);
          iVar14 = iVar14 + 1;
        } while (count != iVar14);
        return;
      }
      if (count + 0x3f < 0x40) {
        return;
      }
      uVar10 = 0;
      uVar12 = 0;
      do {
        uVar9 = puVar2[uVar10];
        uVar11 = uVar12 + 0x40;
        if (count <= uVar12 + 0x40) {
          uVar11 = count;
        }
        uVar13 = uVar11;
        if (uVar9 != 0) {
          uVar13 = uVar12;
          if (uVar9 == 0xffffffffffffffff) {
            if (uVar12 < uVar11) {
              do {
                puVar4 = *(undefined1 **)(pdVar8 + uVar12 * 8);
                *puVar4 = 1;
                plVar1 = (long *)(puVar4 + 8);
                *plVar1 = *plVar1 + *(long *)(pdVar7 + uVar12 * 8);
                uVar12 = uVar12 + 1;
                uVar13 = uVar11;
              } while (uVar11 != uVar12);
            }
          }
          else if (uVar12 < uVar11) {
            uVar17 = 0;
            do {
              if ((uVar9 >> (uVar17 & 0x3f) & 1) != 0) {
                puVar4 = *(undefined1 **)(pdVar8 + uVar17 * 8 + uVar12 * 8);
                *puVar4 = 1;
                plVar1 = (long *)(puVar4 + 8);
                *plVar1 = *plVar1 + *(long *)(pdVar7 + uVar17 * 8 + uVar12 * 8);
              }
              uVar17 = uVar17 + 1;
              uVar13 = uVar11;
            } while (uVar11 - uVar12 != uVar17);
          }
        }
        uVar10 = uVar10 + 1;
        uVar12 = uVar13;
      } while (uVar10 != count + 0x3f >> 6);
      return;
    }
  }
  else if ((input->vector_type == CONSTANT_VECTOR) && (states->vector_type == CONSTANT_VECTOR)) {
    puVar2 = (input->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    if ((puVar2 != (unsigned_long *)0x0) && ((*puVar2 & 1) == 0)) {
      return;
    }
    plVar3 = (long *)input->data;
    puVar4 = *(undefined1 **)states->data;
    *puVar4 = 1;
    plVar1 = (long *)(puVar4 + 8);
    *plVar1 = *plVar1 + count * *plVar3;
    return;
  }
  UnifiedVectorFormat::UnifiedVectorFormat(&local_b8);
  UnifiedVectorFormat::UnifiedVectorFormat(&local_70);
  Vector::ToUnifiedFormat(input,count,&local_b8);
  Vector::ToUnifiedFormat(states,count,&local_70);
  if (local_b8.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
      (unsigned_long *)0x0) {
    if (count != 0) {
      psVar5 = (local_b8.sel)->sel_vector;
      psVar6 = (local_70.sel)->sel_vector;
      iVar14 = 0;
      do {
        iVar15 = iVar14;
        if (psVar5 != (sel_t *)0x0) {
          iVar15 = (idx_t)psVar5[iVar14];
        }
        iVar16 = iVar14;
        if (psVar6 != (sel_t *)0x0) {
          iVar16 = (idx_t)psVar6[iVar14];
        }
        puVar4 = *(undefined1 **)(local_70.data + iVar16 * 8);
        *puVar4 = 1;
        plVar1 = (long *)(puVar4 + 8);
        *plVar1 = *plVar1 + *(long *)(local_b8.data + iVar15 * 8);
        iVar14 = iVar14 + 1;
      } while (count != iVar14);
    }
  }
  else if (count != 0) {
    psVar5 = (local_b8.sel)->sel_vector;
    psVar6 = (local_70.sel)->sel_vector;
    iVar14 = 0;
    do {
      iVar15 = iVar14;
      if (psVar5 != (sel_t *)0x0) {
        iVar15 = (idx_t)psVar5[iVar14];
      }
      iVar16 = iVar14;
      if (psVar6 != (sel_t *)0x0) {
        iVar16 = (idx_t)psVar6[iVar14];
      }
      if ((local_b8.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[iVar15 >> 6]
           >> (iVar15 & 0x3f) & 1) != 0) {
        puVar4 = *(undefined1 **)(local_70.data + iVar16 * 8);
        *puVar4 = 1;
        plVar1 = (long *)(puVar4 + 8);
        *plVar1 = *plVar1 + *(long *)(local_b8.data + iVar15 * 8);
      }
      iVar14 = iVar14 + 1;
    } while (count != iVar14);
  }
  if (local_70.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_70.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_70.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_70.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_b8.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_b8.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_b8.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_b8.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return;
}

Assistant:

static void UnaryScatter(Vector &input, Vector &states, AggregateInputData &aggr_input_data, idx_t count) {
		if (input.GetVectorType() == VectorType::CONSTANT_VECTOR &&
		    states.GetVectorType() == VectorType::CONSTANT_VECTOR) {
			if (OP::IgnoreNull() && ConstantVector::IsNull(input)) {
				// constant NULL input in function that ignores NULL values
				return;
			}
			// regular constant: get first state
			auto idata = ConstantVector::GetData<INPUT_TYPE>(input);
			auto sdata = ConstantVector::GetData<STATE_TYPE *>(states);
			AggregateUnaryInput input_data(aggr_input_data, ConstantVector::Validity(input));
			OP::template ConstantOperation<INPUT_TYPE, STATE_TYPE, OP>(**sdata, *idata, input_data, count);
#ifndef DUCKDB_SMALLER_BINARY
		} else if (input.GetVectorType() == VectorType::FLAT_VECTOR &&
		           states.GetVectorType() == VectorType::FLAT_VECTOR) {
			auto idata = FlatVector::GetData<INPUT_TYPE>(input);
			auto sdata = FlatVector::GetData<STATE_TYPE *>(states);
			UnaryFlatLoop<STATE_TYPE, INPUT_TYPE, OP>(idata, aggr_input_data, sdata, FlatVector::Validity(input),
			                                          count);
#endif
		} else {
			UnifiedVectorFormat idata, sdata;
			input.ToUnifiedFormat(count, idata);
			states.ToUnifiedFormat(count, sdata);
			UnaryScatterLoop<STATE_TYPE, INPUT_TYPE, OP>(UnifiedVectorFormat::GetData<INPUT_TYPE>(idata),
			                                             aggr_input_data, (STATE_TYPE **)sdata.data, *idata.sel,
			                                             *sdata.sel, idata.validity, count);
		}
	}